

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cpp
# Opt level: O2

double icu_63::double_conversion::RadixStringToIeee<3,char*>
                 (char **current,char *end,bool sign,bool allow_trailing_junk,
                 double junk_string_value,bool read_as_double,bool *result_is_junk)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  double dVar4;
  int iVar5;
  char *pcVar6;
  char *extraout_RDX;
  byte bVar7;
  ulong uVar8;
  uint uVar9;
  byte bVar10;
  long lVar11;
  sbyte sVar12;
  DiyFp diy_fp;
  
  *result_is_junk = true;
  pcVar6 = *current;
  while (*pcVar6 == '0') {
    pcVar6 = pcVar6 + 1;
    *current = pcVar6;
    if (pcVar6 == end) {
      *result_is_junk = false;
      if (sign) {
        return -0.0;
      }
      return 0.0;
    }
  }
  sVar12 = 0x18;
  if (read_as_double) {
    sVar12 = 0x35;
  }
  lVar11 = 0;
  while( true ) {
    iVar5 = (int)*pcVar6;
    if ((0x37 < iVar5) || (9 < iVar5 - 0x30U)) {
      if ((!allow_trailing_junk) && (bVar2 = AdvanceToNonspace<char*>(current,end), bVar2)) {
        return junk_string_value;
      }
      goto LAB_002447b9;
    }
    lVar11 = (long)iVar5 + lVar11 * 8 + -0x30;
    uVar8 = lVar11 >> sVar12;
    pcVar6 = pcVar6 + 1;
    if ((int)uVar8 != 0) break;
    *current = pcVar6;
    if (pcVar6 == end) {
LAB_002447b9:
      *result_is_junk = false;
      if (sign) {
        if (lVar11 == 0) {
          return -0.0;
        }
        lVar11 = -lVar11;
      }
      return (double)lVar11;
    }
  }
  iVar5 = 1;
  bVar7 = 0;
  for (; 1 < (int)(uint)uVar8; uVar8 = (ulong)((uint)uVar8 >> 1)) {
    iVar5 = iVar5 + 1;
    bVar7 = bVar7 + 1;
  }
  uVar8 = lVar11 >> ((byte)iVar5 & 0x3f);
  uVar9 = (uint)lVar11 & ~(-1 << ((byte)iVar5 & 0x1f));
  iVar5 = -iVar5;
  bVar10 = 1;
  for (; *current = pcVar6, pcVar6 != end; pcVar6 = pcVar6 + 1) {
    cVar1 = *pcVar6;
    if ((0x37 < cVar1) || (9 < (int)cVar1 - 0x30U)) break;
    bVar10 = bVar10 & cVar1 == '0';
    iVar5 = iVar5 + -3;
  }
  if ((!allow_trailing_junk) &&
     (bVar2 = AdvanceToNonspace<char*>(current,end), pcVar6 = extraout_RDX, bVar2)) {
    return junk_string_value;
  }
  uVar3 = 1 << (bVar7 & 0x1f);
  if ((int)uVar3 < (int)uVar9) {
    uVar8 = uVar8 + 1;
  }
  else if (uVar9 == uVar3) {
    uVar8 = uVar8 + ((byte)(~bVar10 | (byte)uVar8) & 1);
  }
  bVar2 = (uVar8 >> sVar12 & 1) != 0;
  diy_fp.f_ = (ulong)((uint)bVar2 - iVar5);
  *result_is_junk = false;
  diy_fp._8_8_ = pcVar6;
  dVar4 = (double)Double::DiyFpToUint64((Double *)((long)uVar8 >> bVar2),diy_fp);
  return dVar4;
}

Assistant:

static double RadixStringToIeee(Iterator* current,
                                Iterator end,
                                bool sign,
                                bool allow_trailing_junk,
                                double junk_string_value,
                                bool read_as_double,
                                bool* result_is_junk) {
  ASSERT(*current != end);

  const int kDoubleSize = Double::kSignificandSize;
  const int kSingleSize = Single::kSignificandSize;
  const int kSignificandSize = read_as_double? kDoubleSize: kSingleSize;

  *result_is_junk = true;

  // Skip leading 0s.
  while (**current == '0') {
    ++(*current);
    if (*current == end) {
      *result_is_junk = false;
      return SignedZero(sign);
    }
  }

  int64_t number = 0;
  int exponent = 0;
  const int radix = (1 << radix_log_2);

  do {
    int digit;
    if (IsDecimalDigitForRadix(**current, radix)) {
      digit = static_cast<char>(**current) - '0';
    } else if (IsCharacterDigitForRadix(**current, radix, 'a')) {
      digit = static_cast<char>(**current) - 'a' + 10;
    } else if (IsCharacterDigitForRadix(**current, radix, 'A')) {
      digit = static_cast<char>(**current) - 'A' + 10;
    } else {
      if (allow_trailing_junk || !AdvanceToNonspace(current, end)) {
        break;
      } else {
        return junk_string_value;
      }
    }

    number = number * radix + digit;
    int overflow = static_cast<int>(number >> kSignificandSize);
    if (overflow != 0) {
      // Overflow occurred. Need to determine which direction to round the
      // result.
      int overflow_bits_count = 1;
      while (overflow > 1) {
        overflow_bits_count++;
        overflow >>= 1;
      }

      int dropped_bits_mask = ((1 << overflow_bits_count) - 1);
      int dropped_bits = static_cast<int>(number) & dropped_bits_mask;
      number >>= overflow_bits_count;
      exponent = overflow_bits_count;

      bool zero_tail = true;
      for (;;) {
        ++(*current);
        if (*current == end || !isDigit(**current, radix)) break;
        zero_tail = zero_tail && **current == '0';
        exponent += radix_log_2;
      }

      if (!allow_trailing_junk && AdvanceToNonspace(current, end)) {
        return junk_string_value;
      }

      int middle_value = (1 << (overflow_bits_count - 1));
      if (dropped_bits > middle_value) {
        number++;  // Rounding up.
      } else if (dropped_bits == middle_value) {
        // Rounding to even to consistency with decimals: half-way case rounds
        // up if significant part is odd and down otherwise.
        if ((number & 1) != 0 || !zero_tail) {
          number++;  // Rounding up.
        }
      }

      // Rounding up may cause overflow.
      if ((number & ((int64_t)1 << kSignificandSize)) != 0) {
        exponent++;
        number >>= 1;
      }
      break;
    }
    ++(*current);
  } while (*current != end);

  ASSERT(number < ((int64_t)1 << kSignificandSize));
  ASSERT(static_cast<int64_t>(static_cast<double>(number)) == number);

  *result_is_junk = false;

  if (exponent == 0) {
    if (sign) {
      if (number == 0) return -0.0;
      number = -number;
    }
    return static_cast<double>(number);
  }

  ASSERT(number != 0);
  return Double(DiyFp(number, exponent)).value();
}